

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCData_Sequence_Parser.cpp
# Opt level: O2

SequenceParser * __thiscall
ASDCP::DCData::SequenceParser::OpenRead(SequenceParser *this,string *filename)

{
  h__SequenceParser *this_00;
  
  this_00 = (h__SequenceParser *)operator_new(0x90);
  h__SequenceParser::h__SequenceParser(this_00);
  mem_ptr<ASDCP::DCData::SequenceParser::h__SequenceParser>::set
            ((mem_ptr<ASDCP::DCData::SequenceParser::h__SequenceParser> *)
             &filename->_M_string_length,this_00);
  h__SequenceParser::OpenRead((h__SequenceParser *)this,(string *)filename->_M_string_length);
  if (*(int *)&this->_vptr_SequenceParser < 0) {
    filename->_M_string_length = 0;
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::SequenceParser::OpenRead(const std::string& filename) const
{
  const_cast<ASDCP::DCData::SequenceParser*>(this)->m_Parser = new h__SequenceParser;

  Result_t result = m_Parser->OpenRead(filename);

  if ( ASDCP_FAILURE(result) )
    const_cast<ASDCP::DCData::SequenceParser*>(this)->m_Parser.release();

  return result;
}